

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O1

void bench_interpolate_step
               (vector<void_(*)(int,_int,_response_layer_*,_response_layer_*,_response_layer_*,_float_*),_std::allocator<void_(*)(int,_int,_response_layer_*,_response_layer_*,_response_layer_*,_float_*)>_>
                *functions,fasthessian *fh,
               vector<benchmark_data,_std::allocator<benchmark_data>_> *data)

{
  response_layer *top;
  response_layer *bottom;
  response_layer *middle;
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int row;
  ulong uVar5;
  int iVar6;
  int local_60;
  int local_5c;
  ulong local_58;
  
  if (*(long *)(functions + 8) != *(long *)functions) {
    local_58 = 0;
    do {
      if (fh->octaves < 1) {
        local_60 = 1;
      }
      else {
        local_60 = 1;
        iVar2 = 0;
        local_5c = 0;
        do {
          do {
            lVar4 = (long)iVar2;
            lVar3 = (long)local_5c * 0x10;
            top = fh->response_map[*(int *)(&DAT_001ad1a8 + lVar4 * 4 + lVar3)];
            iVar6 = iVar2;
            if (0 < top->height) {
              bottom = fh->response_map[*(int *)(&DAT_001ad1a0 + lVar4 * 4 + lVar3)];
              middle = fh->response_map[*(int *)(&DAT_001ad1a4 + lVar4 * 4 + lVar3)];
              row = 0;
              do {
                if (0 < top->width) {
                  iVar6 = 0;
                  do {
                    bVar1 = is_extremum(row,iVar6,top,middle,bottom,fh->thresh);
                    if (bVar1) {
                      perf_interpolate_step
                                (*(_func_void_int_int_response_layer_ptr_response_layer_ptr_response_layer_ptr_float_ptr
                                   **)(*(long *)functions + local_58 * 8),row,iVar6,top,middle,
                                 bottom,(benchmark_data *)(*(long *)data + local_58 * 0x238));
                      local_60 = local_60 + 1;
                      if (local_60 == 4) {
                        iVar6 = top->width;
                        row = top->height;
                        local_5c = fh->octaves;
                        iVar2 = 2;
                        local_60 = 4;
                      }
                    }
                    iVar6 = iVar6 + 1;
                  } while (iVar6 < top->width);
                }
                row = row + 1;
                iVar6 = iVar2;
              } while (row < top->height);
            }
            iVar2 = iVar6 + 1;
          } while (iVar6 < 1);
          local_5c = local_5c + 1;
          iVar2 = 0;
        } while (local_5c < fh->octaves);
      }
      uVar5 = (ulong)local_60;
      lVar3 = *(long *)data;
      lVar4 = local_58 * 0x238;
      *(ulong *)(lVar3 + 0x218 + lVar4) = *(ulong *)(lVar3 + 0x218 + lVar4) / uVar5;
      *(ulong *)(lVar3 + 0x228 + lVar4) = *(ulong *)(lVar3 + 0x228 + lVar4) / uVar5;
      *(ulong *)(lVar3 + 0x220 + lVar4) = *(ulong *)(lVar3 + 0x220 + lVar4) / uVar5;
      *(double *)(lVar3 + 0x230 + lVar4) = *(double *)(lVar3 + 0x230 + lVar4) / (double)local_60;
      local_58 = local_58 + 1;
    } while (local_58 < (ulong)(*(long *)(functions + 8) - *(long *)functions >> 3));
  }
  return;
}

Assistant:

void bench_interpolate_step(const std::vector<void (*)(int, int, struct response_layer *, struct response_layer *, struct response_layer *, float[3])> &functions, 
                            struct fasthessian *fh, 
                            std::vector<struct benchmark_data> &data) {
    
    assert(functions.size() == data.size());

    // Iterating through all functions that should be benchmarked
    for (int j = 0; j < functions.size(); ++j) {

        int counter = 1;
        // Specifies how many times the benchmarikng for interpolate_step is called.
        // The average of the outcome will be taken
        int limit = 4;

        assert(fh != NULL);

        // filter index map
        const int filter_map[NUM_OCTAVES][NUM_LAYERS] = {
            {0, 1, 2, 3}, 
            {1, 3, 4, 5}, 
            {3, 5, 6, 7},
            //{5, 7, 8, 9},
            //{7, 9, 10, 11}
        };

        // getting response layers
        struct response_layer *bottom;
        struct response_layer *middle;
        struct response_layer *top;

        // iterating through all octaves and each layer of octave in window of three (top, middle, bottom)
        for (int o = 0; o < fh->octaves; ++o) {
            // TODO: (Sebastian) allow for fh->layers != 4 as well (note that fh->layers>=3 has to hold)
            for (int i = 0; i <= 1; ++i) {
                // assigning respective bottom, middle and top response layer
                bottom = fh->response_map[filter_map[o][i]];
                middle = fh->response_map[filter_map[o][i + 1]];
                top = fh->response_map[filter_map[o][i + 2]];

                // iterating over middle response layer at density of the most sparse layer (always top),
                // to find maxima accreoss scale and space
                for (int r = 0; r < top->height; ++r) {
                    for (int c = 0; c < top->width; ++c) {
                        // checking if current pixel position is local maximum in 3x3x3 maximum and above threshold
                        if (is_extremum(r, c, top, middle, bottom, fh->thresh)) {
                            perf_interpolate_step(functions[j], r, c, top, middle, bottom, data[j]);
                            counter++;
                            if (counter == limit) {
                                c = top->width;
                                r = top->height;
                                i = 2;
                                o = fh->octaves;
                            }
                        }
                    }
                }
            }
        }

        data[j].avg_cycles /= counter;
        data[j].max_cycles /= counter;
        data[j].min_cycles /= counter;
        data[j].flops_per_cycle /= counter;

    }

}